

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemView::currentChanged
          (QAbstractItemView *this,QModelIndex *current,QModelIndex *previous)

{
  int iVar1;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar2;
  Data *this_01;
  QAbstractItemModel *pQVar3;
  bool on;
  int iVar4;
  uint uVar5;
  QEditorInfo *pQVar6;
  Node<QWidget_*,_QHashDummyValue> *pNVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QWidget *editor;
  QPersistentModelIndex persistentCurrent;
  QModelIndex local_70;
  QModelIndex local_58;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&local_40,current);
  if (((-1 < previous->r) && (-1 < previous->c)) && ((previous->m).ptr != (QAbstractItemModel *)0x0)
     ) {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00->model + 0x148))(&local_58,this_00->model,previous);
    pQVar6 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_58);
    pDVar2 = (pQVar6->widget).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      local_70._0_8_ = (QObject *)0x0;
    }
    else {
      local_70._0_8_ = (pQVar6->widget).wp.value;
    }
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
      update(this,previous);
    }
    if ((QObject *)local_70._0_8_ != (QObject *)0x0) {
      this_01 = (this_00->persistent).q_hash.d;
      if (this_01 != (Data *)0x0) {
        pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                 findNode<QWidget*>((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)this_01,
                                    (QWidget **)&local_70);
        if (pNVar7 != (Node<QWidget_*,_QHashDummyValue> *)0x0) goto LAB_00545d1e;
      }
      iVar4 = current->r;
      iVar1 = previous->r;
      (**(code **)(*(long *)this + 0x298))(this,local_70._0_8_);
      (**(code **)(*(long *)this + 0x290))(this,local_70._0_8_,(iVar4 != iVar1) * '\x03');
    }
  }
LAB_00545d1e:
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_40);
  uVar8 = (**(code **)(*(long *)this + 0x2e8))(this,&local_58,0);
  if ((uVar8 & 0x10) == 0) {
    QPersistentModelIndex::operator=(&this_00->currentSelectionStartIndex,&local_58);
  }
  if (((-1 < local_58.r) && (-1 < (long)local_58._0_8_)) &&
     ((local_58.m.ptr != (QAbstractItemModel *)0x0 && ((this_00->autoScrollTimer).m_id == Invalid)))
     ) {
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) {
      this_00->shouldScrollToCurrentOnShow = this_00->autoScroll;
    }
    else {
      if (this_00->autoScroll != false) {
        (**(code **)(*(long *)this + 0x1e8))(this,&local_58,0);
      }
      update(this,&local_58);
      (**(code **)(*(long *)this + 0x2e0))(this,&local_58,1,0);
      iVar1 = local_58.r;
      pQVar3 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,&this_00->root);
      iVar4 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_70);
      if (iVar1 == iVar4 + -1) {
        QAbstractItemViewPrivate::fetchMore(this_00);
      }
    }
  }
  on = false;
  if (((-1 < local_58.r) && (on = false, -1 < (long)local_58._0_8_)) &&
     (local_58.m.ptr != (QAbstractItemModel *)0x0)) {
    if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
      on = false;
    }
    else {
      uVar5 = (**(code **)(*(long *)local_58.m.ptr + 0x138))(local_58.m.ptr,&local_58);
      on = SUB41((uVar5 & 2) >> 1,0);
    }
  }
  QWidget::setAttribute((QWidget *)this,WA_InputMethodEnabled,on);
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QAbstractItemView);
    Q_ASSERT(d->model);

    QPersistentModelIndex persistentCurrent(current); // in case commitData() moves things around (QTBUG-127852)

    if (previous.isValid()) {
        QModelIndex buddy = d->model->buddy(previous);
        QWidget *editor = d->editorForIndex(buddy).widget.data();
        if (isVisible()) {
            update(previous);
        }
        if (editor && !d->persistent.contains(editor)) {
            const bool rowChanged = current.row() != previous.row();
            commitData(editor); // might invalidate previous, don't use after this line (QTBUG-127852)
            if (rowChanged)
                closeEditor(editor, QAbstractItemDelegate::SubmitModelCache);
            else
                closeEditor(editor, QAbstractItemDelegate::NoHint);
        }
    }

    const QModelIndex newCurrent = persistentCurrent;

    QItemSelectionModel::SelectionFlags command = selectionCommand(newCurrent, nullptr);
    if ((command & QItemSelectionModel::Current) == 0)
        d->currentSelectionStartIndex = newCurrent;

    if (newCurrent.isValid() && !d->autoScrollTimer.isActive()) {
        if (isVisible()) {
            if (d->autoScroll)
                scrollTo(newCurrent);
            update(newCurrent);
            edit(newCurrent, CurrentChanged, nullptr);
            if (newCurrent.row() == (d->model->rowCount(d->root) - 1))
                d->fetchMore();
        } else {
            d->shouldScrollToCurrentOnShow = d->autoScroll;
        }
    }
    setAttribute(Qt::WA_InputMethodEnabled, (newCurrent.isValid() && (newCurrent.flags() & Qt::ItemIsEditable)));
}